

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  VP8LBitReader *br;
  VP8LColorCache *src;
  VP8LMetadata *hdr;
  VP8LColorCache *dst;
  uint uVar1;
  vp8l_val_t vVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  VP8LColorCache *pVVar13;
  uint *puVar14;
  uint *__dest;
  ulong uVar15;
  ulong *__src;
  long lVar16;
  uint *puVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  HTreeGroup *local_b8;
  int local_98;
  
  iVar20 = dec->last_pixel_;
  uVar11 = (long)iVar20 / (long)width;
  uVar18 = (long)iVar20 % (long)width;
  uVar21 = uVar11 & 0xffffffff;
  uVar15 = uVar18 & 0xffffffff;
  iVar9 = (dec->hdr_).color_cache_size_;
  iVar12 = (int)uVar11;
  local_98 = 0x1000000;
  if (dec->incremental_ != 0) {
    local_98 = iVar12;
  }
  src = &(dec->hdr_).color_cache_;
  local_b8 = (HTreeGroup *)0x0;
  pVVar13 = (VP8LColorCache *)0x0;
  if (0 < iVar9) {
    pVVar13 = src;
  }
  hdr = &dec->hdr_;
  uVar1 = (dec->hdr_).huffman_mask_;
  if (iVar20 < last_row * width) {
    local_b8 = GetHtreeGroupForPos(hdr,(int)uVar18,iVar12);
  }
  br = &dec->br_;
  __dest = data + iVar20;
  dst = &(dec->hdr_).saved_color_cache_;
  puVar17 = __dest;
  while (iVar20 = (int)uVar21, __dest < data + last_row * width) {
    if (local_98 <= iVar20) {
      iVar12 = (dec->br_).eos_;
      (dec->saved_br_).bit_pos_ = (dec->br_).bit_pos_;
      (dec->saved_br_).eos_ = iVar12;
      vVar2 = br->val_;
      puVar3 = (dec->br_).buf_;
      sVar4 = (dec->br_).pos_;
      (dec->saved_br_).len_ = (dec->br_).len_;
      (dec->saved_br_).pos_ = sVar4;
      (dec->saved_br_).val_ = vVar2;
      (dec->saved_br_).buf_ = puVar3;
      dec->saved_last_pixel_ = (int)((ulong)((long)__dest - (long)data) >> 2);
      if (0 < (dec->hdr_).color_cache_size_) {
        VP8LColorCacheCopy(src,dst);
      }
      local_98 = iVar20 + 8;
    }
    uVar19 = (uint)uVar15;
    if ((uVar1 & uVar19) == 0) {
      local_b8 = GetHtreeGroupForPos(hdr,uVar19,iVar20);
    }
    if (local_b8->is_trivial_code != 0) {
      uVar5 = local_b8->literal_arb;
      goto LAB_0010eb6c;
    }
    VP8LFillBitWindow(br);
    if (local_b8->use_packed_table == 0) {
      uVar5 = ReadSymbol(local_b8->htrees[0],br);
      uVar11 = (ulong)uVar5;
LAB_0010e850:
      iVar12 = VP8LIsEndOfStream(br);
      if (iVar12 != 0) break;
      uVar5 = (uint)uVar11;
      if ((int)uVar5 < 0x100) {
        if (local_b8->is_trivial_literal == 0) {
          iVar12 = ReadSymbol(local_b8->htrees[1],br);
          VP8LFillBitWindow(br);
          uVar7 = ReadSymbol(local_b8->htrees[2],br);
          iVar6 = ReadSymbol(local_b8->htrees[3],br);
          iVar8 = VP8LIsEndOfStream(br);
          if (iVar8 != 0) break;
          uVar5 = uVar5 << 8 | iVar12 << 0x10 | uVar7 | iVar6 << 0x18;
        }
        else {
          uVar5 = uVar5 << 8 | local_b8->literal_arb;
        }
LAB_0010eb6c:
        *__dest = uVar5;
        goto LAB_0010eb73;
      }
      if (0x117 < uVar5) {
        if ((int)uVar5 < iVar9 + 0x118) {
          for (; puVar17 < __dest; puVar17 = puVar17 + 1) {
            pVVar13->colors_[(int)(*puVar17 * 0x1e35a7bd >> ((byte)pVVar13->hash_shift_ & 0x1f))] =
                 *puVar17;
          }
          uVar5 = pVVar13->colors_[uVar11 - 0x118];
          goto LAB_0010eb6c;
        }
        goto LAB_0010ec7b;
      }
      uVar5 = GetCopyDistance(uVar5 - 0x100,br);
      iVar12 = ReadSymbol(local_b8->htrees[4],br);
      VP8LFillBitWindow(br);
      iVar12 = GetCopyDistance(iVar12,br);
      iVar12 = PlaneCodeToDistance(width,iVar12);
      iVar6 = VP8LIsEndOfStream(br);
      if (iVar6 != 0) break;
      lVar10 = (long)iVar12;
      if (((long)__dest - (long)data >> 2 < lVar10) ||
         (lVar16 = (long)(int)uVar5, (long)(data + height * width) - (long)__dest >> 2 < lVar16))
      goto LAB_0010ec7b;
      __src = (ulong *)(__dest + -lVar10);
      if ((((ulong)__dest & 3) == 0) && ((3 < (int)uVar5 && (iVar12 < 3)))) {
        if (iVar12 == 1) {
          uVar7 = (uint)*__src;
          uVar11 = CONCAT44(uVar7,uVar7);
          uVar18 = (ulong)uVar7;
        }
        else {
          uVar11 = *__src;
          uVar18 = uVar11;
        }
        puVar14 = __dest;
        uVar7 = uVar5;
        if (((ulong)__dest & 4) != 0) {
          __src = (ulong *)((long)__src + 4);
          *__dest = (uint)uVar18;
          uVar11 = uVar11 << 0x20 | uVar11 >> 0x20;
          puVar14 = __dest + 1;
          uVar7 = uVar5 - 1;
        }
        for (uVar18 = 0; uVar7 >> 1 != uVar18; uVar18 = uVar18 + 1) {
          *(ulong *)(puVar14 + uVar18 * 2) = uVar11;
        }
        if ((uVar7 & 1) != 0) {
          puVar14[(int)(uVar7 & 0xfffffffe)] =
               *(uint *)((long)__src + (long)(int)(uVar7 & 0xfffffffe) * 4);
        }
      }
      else if (iVar12 < (int)uVar5) {
        uVar11 = 0;
        puVar14 = __dest;
        if (0 < (int)uVar5) {
          uVar11 = (ulong)uVar5;
        }
        while (bVar22 = uVar11 != 0, uVar11 = uVar11 - 1, bVar22) {
          *puVar14 = puVar14[-lVar10];
          puVar14 = puVar14 + 1;
        }
      }
      else {
        memcpy(__dest,__src,lVar16 * 4);
      }
      uVar19 = uVar19 + uVar5;
      while( true ) {
        uVar15 = (ulong)uVar19;
        iVar20 = (int)uVar21;
        if ((int)uVar19 < width) break;
        uVar5 = iVar20 + 1;
        if ((uVar5 & 0xf) == 0 && (iVar20 < last_row && process_func != (ProcessRowsFunc)0x0)) {
          (*process_func)(dec,uVar5);
        }
        uVar21 = (ulong)uVar5;
        uVar19 = uVar19 - width;
      }
      if ((uVar1 & uVar19) != 0) {
        local_b8 = GetHtreeGroupForPos(hdr,uVar19,iVar20);
      }
      __dest = __dest + lVar16;
      if (0 < iVar9) {
        for (; puVar17 < __dest; puVar17 = puVar17 + 1) {
          pVVar13->colors_[(int)(*puVar17 * 0x1e35a7bd >> ((byte)pVVar13->hash_shift_ & 0x1f))] =
               *puVar17;
        }
      }
    }
    else {
      iVar12 = (dec->br_).bit_pos_;
      uVar5 = (uint)((dec->br_).val_ >> ((byte)iVar12 & 0x3f)) & 0x3f;
      iVar6 = local_b8->packed_table[uVar5].bits;
      uVar5 = local_b8->packed_table[uVar5].value;
      uVar11 = (ulong)uVar5;
      iVar12 = iVar12 + iVar6;
      if (iVar6 < 0x100) {
        (dec->br_).bit_pos_ = iVar12;
        *__dest = uVar5;
        uVar11 = 0;
      }
      else {
        (dec->br_).bit_pos_ = iVar12 + -0x100;
      }
      iVar12 = VP8LIsEndOfStream(br);
      if (iVar12 != 0) break;
      if ((int)uVar11 != 0) goto LAB_0010e850;
LAB_0010eb73:
      __dest = __dest + 1;
      uVar15 = (ulong)(uVar19 + 1);
      if (width <= (int)(uVar19 + 1)) {
        uVar19 = iVar20 + 1;
        if ((uVar19 & 0xf) == 0 && (iVar20 < last_row && process_func != (ProcessRowsFunc)0x0)) {
          (*process_func)(dec,uVar19);
        }
        uVar15 = 0;
        uVar21 = (ulong)uVar19;
        if (0 < iVar9) {
          for (; puVar17 < __dest; puVar17 = puVar17 + 1) {
            pVVar13->colors_[(int)(*puVar17 * 0x1e35a7bd >> ((byte)pVVar13->hash_shift_ & 0x1f))] =
                 *puVar17;
          }
          uVar21 = (ulong)uVar19;
        }
      }
    }
  }
  iVar9 = VP8LIsEndOfStream(br);
  (dec->br_).eos_ = iVar9;
  if (((dec->incremental_ == 0) || (iVar9 == 0)) || (data + height * width <= __dest)) {
    if (iVar9 == 0) {
      if (process_func != (ProcessRowsFunc)0x0) {
        if (iVar20 < last_row) {
          last_row = iVar20;
        }
        (*process_func)(dec,last_row);
      }
      dec->status_ = VP8_STATUS_OK;
      dec->last_pixel_ = (int)((ulong)((long)__dest - (long)data) >> 2);
      iVar20 = 1;
    }
    else {
LAB_0010ec7b:
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      iVar20 = 0;
    }
  }
  else {
    dec->status_ = VP8_STATUS_SUSPENDED;
    iVar20 = (dec->saved_br_).eos_;
    (dec->br_).bit_pos_ = (dec->saved_br_).bit_pos_;
    (dec->br_).eos_ = iVar20;
    vVar2 = (dec->saved_br_).val_;
    puVar3 = (dec->saved_br_).buf_;
    sVar4 = (dec->saved_br_).pos_;
    (dec->br_).len_ = (dec->saved_br_).len_;
    (dec->br_).pos_ = sVar4;
    br->val_ = vVar2;
    (dec->br_).buf_ = puVar3;
    dec->last_pixel_ = dec->saved_last_pixel_;
    iVar20 = 1;
    if (0 < (dec->hdr_).color_cache_size_) {
      VP8LColorCacheCopy(dst,src);
    }
  }
  return iVar20;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel_ / width;
  int col = dec->last_pixel_ % width;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* src = data + dec->last_pixel_;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size_;
  int next_sync_row = dec->incremental_ ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size_ > 0) ? &hdr->color_cache_ : NULL;
  const int mask = hdr->huffman_mask_;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row_ < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos_ = VP8LIsEndOfStream(br);
  if (dec->incremental_ && br->eos_ && src < src_end) {
    RestoreState(dec);
  } else if (!br->eos_) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status_ = VP8_STATUS_OK;
    dec->last_pixel_ = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos_=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return 0;
}